

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Model::set_allocated_featurevectorizer
          (Model *this,FeatureVectorizer *featurevectorizer)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  FeatureVectorizer *featurevectorizer_local;
  Model *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_Type(this);
  if (featurevectorizer != (FeatureVectorizer *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::InternalHelper<google::protobuf::MessageLite>::GetOwningArena
                   (&featurevectorizer->super_MessageLite);
    message_arena = (Arena *)featurevectorizer;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::FeatureVectorizer>
                              (message_arena_00,featurevectorizer,submessage_arena_00);
    }
    set_has_featurevectorizer(this);
    (this->Type_).pipelineclassifier_ = (PipelineClassifier *)message_arena;
  }
  return;
}

Assistant:

void Model::set_allocated_featurevectorizer(::CoreML::Specification::FeatureVectorizer* featurevectorizer) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_Type();
  if (featurevectorizer) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(featurevectorizer));
    if (message_arena != submessage_arena) {
      featurevectorizer = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, featurevectorizer, submessage_arena);
    }
    set_has_featurevectorizer();
    Type_.featurevectorizer_ = featurevectorizer;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.Model.featureVectorizer)
}